

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

_Bool tcg_out_qemu_ld_slow_path(TCGContext_conflict9 *s,TCGLabelQemuLdst_conflict *l)

{
  TCGMemOpIdx oi_00;
  TCGReg ret;
  MemOp MVar1;
  int rexw_00;
  int rexw;
  tcg_insn_unit **label_ptr;
  TCGReg data_reg;
  MemOp opc;
  TCGMemOpIdx oi;
  TCGLabelQemuLdst_conflict *l_local;
  TCGContext_conflict9 *s_local;
  
  oi_00 = l->oi;
  MVar1 = get_memop(oi_00);
  rexw_00 = (uint)(l->type == TCG_TYPE_I64) << 0xc;
  tcg_patch32(l->label_ptr[0],(*(int *)&s->code_ptr - (int)l->label_ptr[0]) - 4);
  tcg_out_mov(s,TCG_TYPE_I64,TCG_REG_EDI,TCG_AREG0);
  tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)oi_00);
  tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)l->raddr);
  tcg_out_call(s,(tcg_insn_unit *)qemu_ld_helpers[MVar1 & MO_BEQ]);
  ret = l->datalo_reg;
  switch(MVar1 & MO_SSIZE) {
  case MO_8:
  case MO_16:
  case MO_32:
    tcg_out_mov(s,TCG_TYPE_I32,ret,TCG_REG_EAX);
    break;
  case MO_64:
    tcg_out_mov(s,TCG_TYPE_I64,ret,TCG_REG_EAX);
    break;
  case MO_ASHIFT:
    tcg_out_ext8s(s,ret,0,rexw_00);
    break;
  case MO_LESW:
    tcg_out_ext16s(s,ret,0,rexw_00);
    break;
  case MO_LESL:
    tcg_out_ext32s(s,ret,0);
    break;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ,0x768);
    abort();
  }
  tcg_out_jmp(s,l->raddr);
  return true;
}

Assistant:

static bool tcg_out_qemu_ld_slow_path(TCGContext *s, TCGLabelQemuLdst *l)
{
    TCGMemOpIdx oi = l->oi;
    MemOp opc = get_memop(oi);
    TCGReg data_reg;
    tcg_insn_unit **label_ptr = &l->label_ptr[0];
    int rexw = (l->type == TCG_TYPE_I64 ? P_REXW : 0);

    /* resolve label address */
    tcg_patch32(label_ptr[0], s->code_ptr - label_ptr[0] - 4);
    if (TARGET_LONG_BITS > TCG_TARGET_REG_BITS) {
        tcg_patch32(label_ptr[1], s->code_ptr - label_ptr[1] - 4);
    }

    if (TCG_TARGET_REG_BITS == 32) {
        int ofs = 0;

        tcg_out_st(s, TCG_TYPE_PTR, TCG_AREG0, TCG_REG_ESP, ofs);
        ofs += 4;

        tcg_out_st(s, TCG_TYPE_I32, l->addrlo_reg, TCG_REG_ESP, ofs);
        ofs += 4;

        if (TARGET_LONG_BITS == 64) {
            tcg_out_st(s, TCG_TYPE_I32, l->addrhi_reg, TCG_REG_ESP, ofs);
            ofs += 4;
        }

        tcg_out_sti(s, TCG_TYPE_I32, oi, TCG_REG_ESP, ofs);
        ofs += 4;

        tcg_out_sti(s, TCG_TYPE_PTR, (uintptr_t)l->raddr, TCG_REG_ESP, ofs);
    } else {
        tcg_out_mov(s, TCG_TYPE_PTR, tcg_target_call_iarg_regs[0], TCG_AREG0);
        /* The second argument is already loaded with addrlo.  */
        tcg_out_movi(s, TCG_TYPE_I32, tcg_target_call_iarg_regs[2], oi);
        tcg_out_movi(s, TCG_TYPE_PTR, tcg_target_call_iarg_regs[3],
                     (uintptr_t)l->raddr);
    }

    tcg_out_call(s, qemu_ld_helpers[opc & (MO_BSWAP | MO_SIZE)]);

    data_reg = l->datalo_reg;
    switch (opc & MO_SSIZE) {
    case MO_SB:
        tcg_out_ext8s(s, data_reg, TCG_REG_EAX, rexw);
        break;
    case MO_SW:
        tcg_out_ext16s(s, data_reg, TCG_REG_EAX, rexw);
        break;
#if TCG_TARGET_REG_BITS == 64
    case MO_SL:
        tcg_out_ext32s(s, data_reg, TCG_REG_EAX);
        break;
#endif
    case MO_UB:
    case MO_UW:
        /* Note that the helpers have zero-extended to tcg_target_long.  */
    case MO_UL:
        tcg_out_mov(s, TCG_TYPE_I32, data_reg, TCG_REG_EAX);
        break;
    case MO_Q:
        if (TCG_TARGET_REG_BITS == 64) {
            tcg_out_mov(s, TCG_TYPE_I64, data_reg, TCG_REG_RAX);
        } else if (data_reg == TCG_REG_EDX) {
            /* xchg %edx, %eax */
            tcg_out_opc(s, OPC_XCHG_ax_r32 + TCG_REG_EDX, 0, 0, 0);
            tcg_out_mov(s, TCG_TYPE_I32, l->datahi_reg, TCG_REG_EAX);
        } else {
            tcg_out_mov(s, TCG_TYPE_I32, data_reg, TCG_REG_EAX);
            tcg_out_mov(s, TCG_TYPE_I32, l->datahi_reg, TCG_REG_EDX);
        }
        break;
    default:
        tcg_abort();
    }

    /* Jump to the code corresponding to next IR of qemu_st */
    tcg_out_jmp(s, l->raddr);
    return true;
}